

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

GArray * g_array_sized_new(gboolean zero_terminated,gboolean clear,guint elt_size,
                          guint reserved_size)

{
  GRealArray *array_00;
  GRealArray *array;
  guint reserved_size_local;
  guint elt_size_local;
  gboolean clear_local;
  gboolean zero_terminated_local;
  
  array_00 = (GRealArray *)g_slice_alloc(0x20);
  array_00->data = (guint8 *)0x0;
  array_00->len = 0;
  array_00->alloc = 0;
  array_00->field_0x14 = array_00->field_0x14 & 0xfe | zero_terminated != 0;
  array_00->field_0x14 = array_00->field_0x14 & 0xfd | (clear != 0) << 1;
  array_00->elt_size = elt_size;
  array_00->clear_func = (GDestroyNotify)0x0;
  if ((((array_00->field_0x14 & 1) != 0) || (reserved_size != 0)) &&
     (g_array_maybe_expand(array_00,reserved_size), (array_00->field_0x14 & 1) != 0)) {
    memset(array_00->data + array_00->elt_size * array_00->len,0,(ulong)array_00->elt_size);
  }
  return (GArray *)array_00;
}

Assistant:

GArray* g_array_sized_new (gboolean zero_terminated,
        gboolean clear,
        guint    elt_size,
        guint    reserved_size)
{
    GRealArray *array;

    g_return_val_if_fail (elt_size > 0, NULL);

    array = g_slice_new (GRealArray);

    array->data            = NULL;
    array->len             = 0;
    array->alloc           = 0;
    array->zero_terminated = (zero_terminated ? 1 : 0);
    array->clear           = (clear ? 1 : 0);
    array->elt_size        = elt_size;
    array->clear_func      = NULL;

    // g_atomic_ref_count_init (&array->ref_count);

    if (array->zero_terminated || reserved_size != 0)
    {
        g_array_maybe_expand (array, reserved_size);
        g_array_zero_terminate(array);
    }

    return (GArray*) array;
}